

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O3

void parseURL(string *url,string *service,string *hostname,string *path)

{
  long lVar1;
  undefined8 *puVar2;
  long *local_50 [2];
  long local_40 [2];
  
  lVar1 = std::__cxx11::string::find((char *)url,0x1380bb,0);
  if (lVar1 == -1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Can\'t find service name.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)url);
  std::__cxx11::string::operator=((string *)service,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  lVar1 = std::__cxx11::string::find((char *)url,0x1380bd,lVar1 + 3);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)url);
    std::__cxx11::string::operator=((string *)hostname,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)url);
    std::__cxx11::string::operator=((string *)path,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Can\'t find end of host name.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void parseURL( const string& url, string& service, string& hostname, string& path ){
    try {
        // Service (http/https) is up to the ://.
        size_t serviceEnd = url.find( "://" );
        if( serviceEnd == -1 ){
            throw "Can't find service name.";
        }
        service = url.substr( 0, serviceEnd );
        serviceEnd += 3;

        // Host name is up to the first / after the service name marker.
        size_t hostEnd = url.find( "/", serviceEnd );
        if( hostEnd == -1 ){
            throw "Can't find end of host name.";
        }
        hostname = url.substr( serviceEnd, hostEnd - serviceEnd );

        // Path is everything else.
        path = url.substr( hostEnd );
    }
    catch( const char* error ){
        cerr << "Error parsing url \"" << url << "\": " << error << endl;
        exit( BAD_ARGUMENTS );
    }
}